

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Mask.cpp
# Opt level: O3

void __thiscall amrex::Mask::readFrom(Mask *this,istream *is)

{
  istream *this_00;
  int *piVar1;
  int ncomp;
  Box b;
  int local_40;
  Box local_3c;
  
  std::istream::ignore((long)is,100000);
  local_3c.smallend.vect[0] = 1;
  local_3c.smallend.vect[1] = 1;
  local_3c.smallend.vect[2] = 1;
  local_3c.bigend.vect[0] = 0;
  local_3c.bigend.vect[1] = 0;
  local_3c.bigend.vect[2] = 0;
  local_3c.btype.itype = 0;
  this_00 = amrex::operator>>(is,&local_3c);
  std::istream::operator>>((istream *)this_00,&local_40);
  std::istream::ignore((long)is,100000);
  BaseFab<int>::resize(&this->super_BaseFab<int>,&local_3c,local_40,(Arena *)0x0);
  piVar1 = BaseFab<int>::dataPtr(&this->super_BaseFab<int>,0);
  std::istream::read((char *)is,(long)piVar1);
  std::istream::ignore((long)is,100000);
  return;
}

Assistant:

void
Mask::readFrom (std::istream& is)
{
    is.ignore(BL_IGNORE_MAX,':');
    Box b;
    int ncomp;
    is >> b >> ncomp;
    is.ignore(BL_IGNORE_MAX, '\n');
    resize(b,ncomp);
    int *ptr = dataPtr();
    int len = domain.numPts();
    is.read( (char*) ptr, len*sizeof(int) );
    is.ignore(BL_IGNORE_MAX, '\n');
}